

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_tiled_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  bool bVar1;
  int iVar2;
  QThreadPool *pQVar3;
  ulong uVar4;
  int iVar5;
  QSpanData *in_RDX;
  QT_FT_Span *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  int yoff;
  int xoff;
  int image_height;
  int image_width;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_40_7_bfeee2df function;
  Operator op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  int iVar6;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar7;
  QMessageLogger *in_stack_fffffffffffffe90;
  QThreadPool *this;
  int local_160;
  int in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  QSpanData *userData_00;
  undefined1 *local_118;
  undefined1 *local_110 [2];
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  char local_e8 [32];
  undefined1 local_c8 [120];
  long local_50;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  userData_00 = in_RDX;
  memcpy(local_c8,&DAT_00bfdde0,0xb0);
  getOperator(in_RDX,(QT_FT_Span *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
              in_stack_fffffffffffffea4);
  if (local_50 == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiDrawHelper();
    anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb7574a);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe90,
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe84,(char *)in_stack_fffffffffffffe78,(char *)0xb75763);
      QMessageLogger::debug
                (local_e8,
                 "blend_tiled_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit")
      ;
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    blend_tiled_generic(in_EDI,in_RSI,userData_00);
  }
  else {
    iVar7 = (in_RDX->field_23).texture.width;
    iVar6 = (in_RDX->field_23).texture.height;
    iVar2 = qRound(5.9364867750541e-317);
    iVar5 = -iVar2 % iVar7;
    iVar2 = qRound(5.93651296053333e-317);
    local_160 = -iVar2 % iVar6;
    if (iVar5 < 0) {
      iVar5 = iVar7 + iVar5;
    }
    if (local_160 < 0) {
      local_160 = iVar6 + local_160;
    }
    memset(local_110,0xaa,0x28);
    local_110[0] = local_c8;
    local_f8 = local_160;
    iVar2 = (in_EDI + 0x20) / 0x40;
    local_100 = iVar5;
    local_fc = iVar7;
    local_f4 = iVar6;
    pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((1 < iVar2) && (2 < (int)qPixelLayouts[in_RDX->rasterBuffer->format].bpp)) &&
       (pQVar3 != (QThreadPool *)0x0)) {
      this = pQVar3;
      QThread::currentThread();
      uVar4 = QThreadPool::contains((QThread *)pQVar3);
      if ((uVar4 & 1) == 0) {
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_118,0);
        iVar7 = 0;
        for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
          iVar5 = (in_EDI - iVar7) / (iVar2 - iVar6);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4898:5),_true>
                    (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar7,iVar6),iVar5);
          iVar7 = iVar5 + iVar7;
        }
        QSemaphore::acquire((int)&local_118);
        QSemaphore::~QSemaphore((QSemaphore *)&local_118);
        goto LAB_00b759ef;
      }
    }
    blend_tiled_generic_fp::anon_class_40_7_bfeee2df::operator()
              ((anon_class_40_7_bfeee2df *)in_RDX,iVar7,iVar6);
  }
LAB_00b759ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);
    if (!op.funcFP) {
        qCDebug(lcQtGuiDrawHelper, "blend_tiled_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit");
        return blend_tiled_generic(count, spans, userData);
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;

    // Consider tiling optimizing like the other versions.

    auto function = [=, &op](int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * data->texture.const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const QRgbaFloat32 *src = op.srcFetchFP(src_buffer, &op, data, sy, sx, l);
                QRgbaFloat32 *dest = op.destFetchFP(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcFP(dest, src, l, coverage);
                if (op.destStoreFP)
                    op.destStoreFP(data->rasterBuffer, x, spans[c].y, dest, l);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}